

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

char * minihttp::Download(char *url,size_t *sz,POST *post)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  DLSocket dl;
  allocator<char> local_299;
  string local_298;
  undefined1 local_278 [204];
  uint local_1ac;
  _Elt_pointer local_190;
  _Elt_pointer local_180;
  _Map_pointer local_178;
  _Elt_pointer local_170;
  _Elt_pointer local_168;
  _Map_pointer local_158;
  bool local_47;
  undefined2 local_45;
  char *local_40;
  undefined2 uStack_38;
  undefined6 uStack_36;
  undefined2 uStack_30;
  undefined8 uStack_2e;
  
  if (_networkInitDone == '\0') {
    _networkInitDone = '\x01';
  }
  HttpSocket::HttpSocket((HttpSocket *)local_278);
  local_278._0_8_ = &PTR__HttpSocket_0010ed50;
  local_40 = (char *)0x0;
  uStack_38 = 0;
  uStack_36 = 0;
  uStack_30 = 0;
  uStack_2e = 0;
  if (local_278._32_4_ != 0x10000) {
    local_278._8_8_ = realloc((void *)local_278._8_8_,0x10000);
  }
  local_278._32_4_ = 0x10000;
  local_278._36_4_ = 0xffff;
  local_278._24_8_ = local_278._8_8_;
  local_278._16_8_ = local_278._8_8_;
  local_278[0x30] = false;
  _SetNonBlocking(local_278._56_8_,false);
  local_45._0_1_ = true;
  local_45._1_1_ = false;
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"minihttp","");
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x68));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,url,&local_299);
  HttpSocket::Download((HttpSocket *)local_278,&local_298,(char *)0x0,(void *)0x0,post);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  while ((((local_278._56_8_ != -1 || (local_1ac != 0)) || ((local_47 & 1U) != 0)) ||
         (((long)local_170 - (long)local_168 >> 3) * -0x7b425ed097b425ed +
          (((long)local_158 - (long)local_178 >> 3) + -1 + (ulong)(local_158 == (_Map_pointer)0x0))
          * 2 != ((long)local_180 - (long)local_190 >> 3) * 0x7b425ed097b425ed))) {
    TcpSocket::update((TcpSocket *)local_278);
  }
  if ((uStack_2e._6_1_ == '\x01') && (uStack_2e._7_1_ != '\x01')) {
    pcVar2 = local_40;
    if (sz != (size_t *)0x0) {
      *sz = CONCAT62(uStack_36,uStack_38);
    }
  }
  else {
    free(local_40);
    pcVar2 = (char *)0x0;
  }
  HttpSocket::~HttpSocket((HttpSocket *)local_278);
  return pcVar2;
}

Assistant:

char *Download(const char *url, size_t *sz, const POST *post /* = NULL */)
{
    if(!_networkInitDone)
        if(!InitNetwork())
            return NULL;

    DLSocket dl;
    dl.SetBufsizeIn(64 * 1024);
    dl.SetNonBlocking(false);
    dl.SetFollowRedirect(true);
    dl.SetAlwaysHandle(false);
    dl.SetUserAgent("minihttp");
    dl.Download(url, NULL, NULL, post);

    while(dl.isOpen() || dl.HasPendingTask())
        dl.update();

    if(!dl.finished || dl.fail)
    {
        free(dl.buf);
        return NULL;
    }

    if(sz)
        *sz = dl.bufsz;

    // FIXME: if the body is empty (aka the HTTP reply contained entirely of headers only), buf was not allocated and is still NULL.
    // Might want to return 1 malloc'd zero byte in that case?
    return dl.buf;
}